

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5Bm25Function(Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
                     sqlite3_value **apVal)

{
  u64 n;
  double dVar1;
  void *__s;
  double dVar2;
  uint uVar3;
  Fts5Context *pFVar4;
  int errCode;
  uint uVar5;
  Fts5Context *__s_00;
  ulong uVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  int nInst;
  sqlite3_int64 nRow;
  sqlite3_int64 nToken;
  int io;
  int local_64;
  sqlite3_int64 local_60;
  Fts5Context *local_58;
  sqlite3_int64 local_50;
  long local_48;
  int local_3c;
  sqlite3_value **local_38;
  
  local_64 = 0;
  local_3c = nVal;
  local_38 = apVal;
  __s_00 = (Fts5Context *)(*pApi->xGetAuxdata)(pFts,0);
  if (__s_00 == (Fts5Context *)0x0) {
    __s_00 = (Fts5Context *)0x0;
    local_60 = 0;
    local_50 = 0;
    uVar5 = (*pApi->xPhraseCount)(pFts);
    iVar7 = sqlite3_initialize();
    errCode = 7;
    if (iVar7 == 0) {
      n = (long)(int)(uVar5 * 2) * 8 + 0x20;
      local_58 = pFts;
      __s_00 = (Fts5Context *)sqlite3Malloc(n);
      if (__s_00 == (Fts5Context *)0x0) {
        __s_00 = (Fts5Context *)0x0;
      }
      else {
        memset(__s_00,0,n);
        pFVar4 = local_58;
        *(uint *)__s_00 = uVar5;
        *(Fts5Context **)(__s_00 + 0x10) = __s_00 + 0x20;
        *(Fts5Context **)(__s_00 + 0x18) = __s_00 + (long)(int)uVar5 * 8 + 0x20;
        errCode = (*pApi->xRowCount)(local_58,&local_60);
        if ((errCode == 0) &&
           (errCode = (*pApi->xColumnTotalSize)(pFVar4,-1,&local_50), errCode == 0)) {
          *(double *)(__s_00 + 8) = (double)local_50 / (double)local_60;
          if (0 < (int)uVar5) {
            uVar6 = 0;
            do {
              local_48 = 0;
              errCode = (*pApi->xQueryPhrase)(local_58,(int)uVar6,&local_48,fts5CountCb);
              if (errCode != 0) goto LAB_001b0509;
              dVar10 = log(((double)(local_60 - local_48) + 0.5) / ((double)local_48 + 0.5));
              *(ulong *)(*(long *)(__s_00 + 0x10) + uVar6 * 8) =
                   ~-(ulong)(0.0 < dVar10) & 0x3eb0c6f7a0b5ed8d |
                   (ulong)dVar10 & -(ulong)(0.0 < dVar10);
              uVar6 = uVar6 + 1;
            } while (uVar5 != uVar6);
          }
          pFts = local_58;
          errCode = (*pApi->xSetAuxdata)(local_58,__s_00,sqlite3_free);
          if (errCode != 0) goto LAB_001b0511;
          goto LAB_001b02dd;
        }
      }
    }
LAB_001b0509:
    sqlite3_free(__s_00);
    goto LAB_001b0511;
  }
LAB_001b02dd:
  __s = *(void **)(__s_00 + 0x18);
  local_58 = __s_00;
  memset(__s,0,(long)(int)*(uint *)__s_00 << 3);
  errCode = (*pApi->xInstCount)(pFts,&local_64);
  if ((errCode == 0) && (0 < local_64)) {
    iVar7 = 0;
    do {
      errCode = (*pApi->xInst)(pFts,iVar7,(int *)&local_60,(int *)&local_50,(int *)&local_48);
      if (errCode != 0) goto LAB_001b0511;
      uVar8 = 0;
      uVar9 = 0x3ff00000;
      if ((int)local_50 < local_3c) {
        dVar10 = sqlite3VdbeRealValue(local_38[(int)local_50]);
        uVar8 = SUB84(dVar10,0);
        uVar9 = (undefined4)((ulong)dVar10 >> 0x20);
      }
      *(double *)((long)__s + (long)(int)local_60 * 8) =
           (double)CONCAT44(uVar9,uVar8) + *(double *)((long)__s + (long)(int)local_60 * 8);
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_64);
LAB_001b0453:
    errCode = (*pApi->xColumnSize)(pFts,-1,(int *)&local_60);
    dVar10 = (double)(int)local_60 * 0.75;
  }
  else {
    if (errCode == 0) goto LAB_001b0453;
    dVar10 = 0.0;
  }
  if (errCode == 0) {
    uVar5 = *(uint *)local_58;
    uVar3 = 0;
    if (0 < (int)uVar5) {
      uVar3 = uVar5;
    }
    if ((int)uVar5 < 1) {
      dVar2 = 0.0;
    }
    else {
      dVar2 = 0.0;
      uVar6 = 0;
      do {
        dVar1 = *(double *)((long)__s + uVar6 * 8);
        dVar2 = dVar2 + ((dVar1 * 2.2) / (dVar1 + (dVar10 / *(double *)(local_58 + 8) + 0.25) * 1.2)
                        ) * *(double *)(*(long *)(local_58 + 0x10) + uVar6 * 8);
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    sqlite3VdbeMemSetDouble(pCtx->pOut,-dVar2);
    return;
  }
LAB_001b0511:
  sqlite3_result_error_code(pCtx,errCode);
  return;
}

Assistant:

static void fts5Bm25Function(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  const double k1 = 1.2;          /* Constant "k1" from BM25 formula */
  const double b = 0.75;          /* Constant "b" from BM25 formula */
  int rc = SQLITE_OK;             /* Error code */
  double score = 0.0;             /* SQL function return value */
  Fts5Bm25Data *pData;            /* Values allocated/calculated once only */
  int i;                          /* Iterator variable */
  int nInst = 0;                  /* Value returned by xInstCount() */
  double D = 0.0;                 /* Total number of tokens in row */
  double *aFreq = 0;              /* Array of phrase freq. for current row */

  /* Calculate the phrase frequency (symbol "f(qi,D)" in the documentation)
  ** for each phrase in the query for the current row. */
  rc = fts5Bm25GetData(pApi, pFts, &pData);
  if( rc==SQLITE_OK ){
    aFreq = pData->aFreq;
    memset(aFreq, 0, sizeof(double) * pData->nPhrase);
    rc = pApi->xInstCount(pFts, &nInst);
  }
  for(i=0; rc==SQLITE_OK && i<nInst; i++){
    int ip; int ic; int io;
    rc = pApi->xInst(pFts, i, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      double w = (nVal > ic) ? sqlite3_value_double(apVal[ic]) : 1.0;
      aFreq[ip] += w;
    }
  }

  /* Figure out the total size of the current row in tokens. */
  if( rc==SQLITE_OK ){
    int nTok;
    rc = pApi->xColumnSize(pFts, -1, &nTok);
    D = (double)nTok;
  }

  /* Determine the BM25 score for the current row. */
  for(i=0; rc==SQLITE_OK && i<pData->nPhrase; i++){
    score += pData->aIDF[i] * (
      ( aFreq[i] * (k1 + 1.0) ) / 
      ( aFreq[i] + k1 * (1 - b + b * D / pData->avgdl) )
    );
  }
  
  /* If no error has occurred, return the calculated score. Otherwise,
  ** throw an SQL exception.  */
  if( rc==SQLITE_OK ){
    sqlite3_result_double(pCtx, -1.0 * score);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
}